

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

bool __thiscall GlobOpt::DoFieldPRE(GlobOpt *this,Loop *loop)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JITTimeFunctionBody *pJVar4;
  FunctionJITTimeInfo *pFVar5;
  JITTimeProfileInfo *this_00;
  
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar2 = JITTimeFunctionBody::GetSourceContextId(pJVar4);
  pFVar5 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar3 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar5);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FieldPREPhase,uVar2,uVar3);
  if (bVar1) {
    return false;
  }
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar2 = JITTimeFunctionBody::GetSourceContextId(pJVar4);
  pFVar5 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar3 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar5);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,FieldPREPhase,uVar2,uVar3);
  if (!bVar1) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar4);
    if (bVar1) {
      pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar4);
      bVar1 = JITTimeProfileInfo::IsFieldPREDisabled(this_00);
      if (bVar1) {
        return false;
      }
    }
    bVar1 = DoFieldOpts(this,loop);
    return bVar1;
  }
  return true;
}

Assistant:

bool
GlobOpt::DoFieldPRE(Loop *loop) const
{
    if (PHASE_OFF(Js::FieldPREPhase, this->func))
    {
        return false;
    }

    if (PHASE_FORCE(Js::FieldPREPhase, func))
    {
        // Force always turns on field PRE
        return true;
    }

    if (this->func->HasProfileInfo() && this->func->GetReadOnlyProfileInfo()->IsFieldPREDisabled())
    {
        return false;
    }

    return DoFieldOpts(loop);
}